

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall embree::TutorialApplication::displayFunc(TutorialApplication *this)

{
  Camera *this_00;
  Averaged<double> *this_01;
  float fVar1;
  PerspectiveCameraNode *pPVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  ostream *poVar8;
  int64_t iVar9;
  ImDrawData *draw_data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_02;
  TutorialApplication *this_03;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  AffineSpace3fa xfm;
  ISPCCamera ispccamera;
  double local_228;
  char *local_208;
  long local_200;
  char local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  ios_base local_158 [268];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c [3];
  float local_1c;
  
  dVar4 = getSeconds();
  if (g_motion_blur == true) {
    fVar10 = (float)(dVar4 - this->time0);
  }
  else if (this->animate == true) {
    fVar10 = sinf(ABS((float)(dVar4 - this->time0)));
    fVar10 = fVar10 * 0.5 + 0.5;
  }
  else {
    fVar10 = this->render_time;
  }
  this_00 = &this->camera;
  fVar1 = this->speed;
  local_1d8 = ZEXT416((uint)((this->moveDelta).field_0.field_0.x * fVar1));
  fVar11 = (this->moveDelta).field_0.field_0.y * fVar1;
  local_1e8 = ZEXT416((uint)(fVar1 * (this->moveDelta).field_0.field_0.z));
  Camera::camera2world((AffineSpace3fa *)&local_1c8.field_1,this_00);
  fVar12 = (float)local_1d8._0_4_ * local_1c8.m128[0] +
           fVar11 * (float)local_1b8._M_allocated_capacity._0_4_ +
           (float)local_1e8._0_4_ * local_1a8;
  fVar13 = (float)local_1d8._0_4_ * local_1c8.m128[1] +
           fVar11 * (float)local_1b8._M_allocated_capacity._4_4_ +
           (float)local_1e8._0_4_ * fStack_1a4;
  fVar14 = (float)local_1d8._0_4_ * local_1c8.m128[2] +
           fVar11 * (float)local_1b8._8_4_ + (float)local_1e8._0_4_ * fStack_1a0;
  fVar15 = (float)local_1d8._0_4_ * local_1c8.m128[3] +
           fVar11 * (float)local_1b8._12_4_ + (float)local_1e8._0_4_ * fStack_19c;
  fVar1 = (this->camera).from.field_0.m128[1];
  fVar11 = (this->camera).from.field_0.m128[2];
  fVar7 = (this->camera).from.field_0.m128[3];
  (this->camera).from.field_0.m128[0] = (this->camera).from.field_0.m128[0] + fVar12;
  (this->camera).from.field_0.m128[1] = fVar1 + fVar13;
  (this->camera).from.field_0.m128[2] = fVar11 + fVar14;
  (this->camera).from.field_0.m128[3] = fVar7 + fVar15;
  fVar1 = (this->camera).to.field_0.m128[1];
  fVar11 = (this->camera).to.field_0.m128[2];
  fVar7 = (this->camera).to.field_0.m128[3];
  (this->camera).to.field_0.m128[0] = fVar12 + (this->camera).to.field_0.m128[0];
  (this->camera).to.field_0.m128[1] = fVar13 + fVar1;
  (this->camera).to.field_0.m128[2] = fVar14 + fVar11;
  (this->camera).to.field_0.m128[3] = fVar15 + fVar7;
  pPVar2 = (this->animated_camera).ptr;
  if (pPVar2 != (PerspectiveCameraNode *)0x0) {
    (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[0x10])(fVar10,&local_1c8);
    *(ulong *)&(this->camera).from.field_0 = CONCAT44(local_1c8.m128[1],local_1c8.m128[0]);
    *(ulong *)((long)&(this->camera).from.field_0 + 8) =
         CONCAT44(local_1c8.m128[3],local_1c8.m128[2]);
    *(ulong *)&(this->camera).to.field_0 =
         CONCAT44(local_1b8._M_allocated_capacity._4_4_,local_1b8._M_allocated_capacity._0_4_);
    *(ulong *)((long)&(this->camera).to.field_0 + 8) = CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    *(ulong *)&(this->camera).up.field_0 = CONCAT44(fStack_1a4,local_1a8);
    *(ulong *)((long)&(this->camera).up.field_0 + 8) = CONCAT44(fStack_19c,fStack_1a0);
    (this->camera).fov = local_198;
  }
  this_02 = local_4c;
  Camera::getISPCCamera((ISPCCamera *)this_02,this_00,(ulong)this->width,(ulong)this->height);
  if (this->print_camera == true) {
    Camera::str_abi_cxx11_((string *)&local_1c8.field_1,this_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)CONCAT44(local_1c8.m128[1],local_1c8.m128[0]),
                        CONCAT44(local_1c8.m128[3],local_1c8.m128[2]));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    this_02 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1c8.m128[1],local_1c8.m128[0]);
    if (this_02 != &local_1b8) {
      operator_delete(this_02);
    }
  }
  initRayStats((TutorialApplication *)this_02);
  (*(this->super_Application)._vptr_Application[0xb])
            (fVar10,this,this->pixels,(ulong)this->width,(ulong)this->height,local_4c);
  dVar5 = getSeconds();
  local_228 = (double)local_1c;
  if ((local_1c == 0.0) && (!NAN(local_1c))) {
    local_228 = dVar5 - dVar4;
  }
  this_01 = &this->avg_render_time;
  this_03 = (TutorialApplication *)this_01;
  Averaged<double>::add(this_01,local_228);
  iVar9 = getNumRays(this_03);
  dVar5 = (double)iVar9 / (local_228 * 1000000.0);
  Averaged<double>::add(&this->avg_mrayps,dVar5);
  glRasterPos2i(0xffffffff,1);
  glPixelZoom(0x3f800000,0xbf800000);
  glDrawPixels(this->width,this->height,0x1908,0x1401,this->pixels);
  ImGui_ImplOpenGL2_NewFrame();
  ImGui_ImplGlfw_NewFrame();
  ImGui::NewFrame();
  ImGui::SetNextWindowBgAlpha(0.3);
  ImGui::Begin("Embree",(bool *)0x0,1);
  (*(this->super_Application)._vptr_Application[10])(this);
  dVar6 = Averaged<double>::get(this_01);
  ImGui::Text("Render: %3.2f fps",-(uint)(dVar6 != 0.0) & SUB84(1.0 / dVar6,0));
  dVar6 = Averaged<double>::get(&this->avg_frame_time);
  ImGui::Text("Total: %3.2f fps",-(uint)(dVar6 != 0.0) & SUB84(1.0 / dVar6,0));
  dVar6 = Averaged<double>::get(&this->avg_mrayps);
  ImGui::Text("%3.2f Mray/s",SUB84(dVar6,0));
  ImGui::End();
  ImGui::Render();
  draw_data = ImGui::GetDrawData();
  ImGui_ImplOpenGL2_RenderDrawData(draw_data);
  glfwSwapBuffers(this->window);
  dVar6 = getSeconds();
  dVar6 = dVar6 - dVar4;
  Averaged<double>::add(&this->avg_frame_time,dVar6);
  if (this->print_frame_rate == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8.field_1);
    lVar3 = *(long *)(CONCAT44(local_1c8.m128[1],local_1c8.m128[0]) + -0x18);
    *(uint *)((long)&local_1b8 + lVar3 + 8) =
         *(uint *)((long)&local_1b8 + lVar3 + 8) & 0xfffffefb | 4;
    *(undefined8 *)
     ((long)&local_1c8 + *(long *)(CONCAT44(local_1c8.m128[1],local_1c8.m128[0]) + -0x18) + 8) = 2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8.field_1,"render: ",8);
    poVar8 = std::ostream::_M_insert<double>(1.0 / local_228);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," fps, ",6);
    poVar8 = std::ostream::_M_insert<double>(local_228 * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms, ",5);
    poVar8 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," Mray/s, ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8.field_1,"total: ",7);
    poVar8 = std::ostream::_M_insert<double>(1.0 / dVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," fps, ",6);
    poVar8 = std::ostream::_M_insert<double>(dVar6 * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms, ",5);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," pixels",7);
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_208,local_200);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (local_208 != local_1f8) {
      operator_delete(local_208);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8.field_1);
    std::ios_base::~ios_base(local_158);
  }
  return;
}

Assistant:

void TutorialApplication::displayFunc()
  {
    double t0 = getSeconds();
    const float time = g_motion_blur ? float(t0-time0) : (animate ? 0.5 * sinf(fabsf(float(t0-time0))) + 0.5 : render_time);
    
    /* update camera */
    camera.move(moveDelta.x*speed, moveDelta.y*speed, moveDelta.z*speed);

    /* update animated camera */
    if (animated_camera)
      camera = Camera(animated_camera->get(time),camera.handedness);
    
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
     if (print_camera)
      std::cout << camera.str() << std::endl;

    /* render image using ISPC */
    initRayStats();
    render(pixels,width,height,time,ispccamera);
    double dt0 = getSeconds()-t0;
    if (ispccamera.render_time != 0.0) dt0 = ispccamera.render_time;
    avg_render_time.add(dt0);
    double mrayps = double(getNumRays())/(1000000.0*dt0);
    avg_mrayps.add(mrayps);

    /* draw pixels to screen */
    glRasterPos2i(-1,1);
    glPixelZoom(1.0f,-1.0f);
    glDrawPixels(width,height,GL_RGBA,GL_UNSIGNED_BYTE,pixels);

    // Start the Dear ImGui frame
    ImGui_ImplOpenGL2_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    
    ImGuiWindowFlags window_flags = 0;
    window_flags |= ImGuiWindowFlags_NoTitleBar;
    //window_flags |= ImGuiWindowFlags_NoScrollbar;
    //window_flags |= ImGuiWindowFlags_MenuBar;
    //window_flags |= ImGuiWindowFlags_NoMove;
    //window_flags |= ImGuiWindowFlags_NoResize;
    //window_flags |= ImGuiWindowFlags_NoCollapse;
    //window_flags |= ImGuiWindowFlags_NoNav;

    //ImGui::GetStyle().WindowBorderSize = 0.0f;
    //ImGui::SetNextWindowPos(ImVec2(width-200,0));
    //ImGui::SetNextWindowSize(ImVec2(200,height));
    ImGui::SetNextWindowBgAlpha(0.3f);
    ImGui::Begin("Embree", nullptr, window_flags);
    drawGUI();
    
    double render_dt = avg_render_time.get();
    double render_fps = render_dt != 0.0 ? 1.0f/render_dt : 0.0;
    ImGui::Text("Render: %3.2f fps",render_fps);

    double total_dt = avg_frame_time.get();
    double total_fps = total_dt != 0.0 ? 1.0f/total_dt : 0.0;
    ImGui::Text("Total: %3.2f fps",total_fps);

#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
    ImGui::Text("%3.2f Mray/s",avg_mrayps.get());
#endif
    ImGui::End();
     
    //ImGui::ShowDemoWindow();
        
    ImGui::Render();
    ImGui_ImplOpenGL2_RenderDrawData(ImGui::GetDrawData());
    
    glfwSwapBuffers(window);

#ifdef __APPLE__
    // work around glfw issue #1334
    // https://github.com/glfw/glfw/issues/1334
    static bool macMoved = false;

    if (!macMoved) {
      int x, y;
      glfwGetWindowPos(window, &x, &y);
      glfwSetWindowPos(window, ++x, y);
      macMoved = true;
    }
#endif

    double dt1 = getSeconds()-t0;
    avg_frame_time.add(dt1);

    if (print_frame_rate)
    {
      std::ostringstream stream;
      stream.setf(std::ios::fixed, std::ios::floatfield);
      stream.precision(2);
      stream << "render: ";
      stream << 1.0f/dt0 << " fps, ";
      stream << dt0*1000.0f << " ms, ";
#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
      stream << mrayps << " Mray/s, ";
#endif
      stream << "total: ";
      stream << 1.0f/dt1 << " fps, ";
      stream << dt1*1000.0f << " ms, ";
      stream << width << "x" << height << " pixels";
      std::cout << stream.str() << std::endl;
    } 
  }